

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

void __thiscall leveldb::Compaction::Compaction(Compaction *this,Options *options,int level)

{
  this->level_ = level;
  this->max_output_file_size_ = options->max_file_size;
  this->input_version_ = (Version *)0x0;
  VersionEdit::VersionEdit(&this->edit_);
  this->inputs_[1].
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->inputs_[1].
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->inputs_[0].
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->inputs_[1].
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->inputs_[0].
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->inputs_[0].
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grandparents_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grandparents_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grandparents_).
  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->grandparent_index_ = 0;
  this->seen_key_ = false;
  this->overlapped_bytes_ = 0;
  this->level_ptrs_[0] = 0;
  this->level_ptrs_[1] = 0;
  this->level_ptrs_[2] = 0;
  this->level_ptrs_[3] = 0;
  this->level_ptrs_[4] = 0;
  this->level_ptrs_[5] = 0;
  this->level_ptrs_[6] = 0;
  return;
}

Assistant:

Compaction::Compaction(const Options* options, int level)
    : level_(level),
      max_output_file_size_(MaxFileSizeForLevel(options, level)),
      input_version_(nullptr),
      grandparent_index_(0),
      seen_key_(false),
      overlapped_bytes_(0) {
  for (int i = 0; i < config::kNumLevels; i++) {
    level_ptrs_[i] = 0;
  }
}